

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  Arena *pAVar1;
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  char *pcVar2;
  LogMessage *pLVar3;
  CppType *v1_00;
  CppType *v2_00;
  Arena *arena;
  MessageLite *ret;
  Voidify local_79;
  CppType local_78;
  CppType local_74;
  Nullable<const_char_*> local_70;
  LogMessage local_58;
  Voidify local_41;
  anon_enum_32 local_40;
  anon_enum_32 local_3c;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  MessageLite *prototype_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)prototype;
  prototype_local._4_4_ = number;
  pEStack_18 = this;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)FindOrNull(this,number);
  if ((Extension *)absl_log_internal_check_op_result == (Extension *)0x0) {
    this_local = (ExtensionSet *)0x0;
  }
  else {
    local_3c = (anon_enum_32)
               ((((Extension *)absl_log_internal_check_op_result)->is_repeated & 1U) == 0);
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_3c);
    local_40 = OPTIONAL_FIELD;
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_40);
    local_38 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                         (v1,v2,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
    if (local_38 != (Nullable<const_char_*>)0x0) {
      pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_38);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x309,pcVar2);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    local_74 = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
    v1_00 = absl::lts_20250127::log_internal::
            GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_74);
    local_78 = CPPTYPE_MESSAGE;
    v2_00 = absl::lts_20250127::log_internal::
            GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_78);
    local_70 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (v1_00,v2_00,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (local_70 != (Nullable<const_char_*>)0x0) {
      pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&ret,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x309,pcVar2);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&ret);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ret);
    }
    if (((byte)absl_log_internal_check_op_result[10] >> 2 & 1) == 0) {
      if (this->arena_ == (Arena *)0x0) {
        arena = *(Arena **)absl_log_internal_check_op_result;
      }
      else {
        arena = (Arena *)MessageLite::New(*(MessageLite **)absl_log_internal_check_op_result);
        MessageLite::CheckTypeAndMergeFrom
                  ((MessageLite *)arena,*(MessageLite **)absl_log_internal_check_op_result);
      }
    }
    else {
      pAVar1 = this->arena_;
      arena = (Arena *)(**(code **)(**(long **)absl_log_internal_check_op_result + 0x40))
                                 (*(long **)absl_log_internal_check_op_result,extension,pAVar1);
      if ((pAVar1 == (Arena *)0x0) && (*(long **)absl_log_internal_check_op_result != (long *)0x0))
      {
        (**(code **)(**(long **)absl_log_internal_check_op_result + 8))();
      }
    }
    Erase(this,prototype_local._4_4_);
    this_local = (ExtensionSet *)arena;
  }
  return (MessageLite *)this_local;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      Arena* const arena = arena_;
      ret = extension->ptr.lazymessage_value->ReleaseMessage(prototype, arena);
      if (arena == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      if (arena_ == nullptr) {
        ret = extension->ptr.message_value;
      } else {
        // ReleaseMessage() always returns a heap-allocated message, and we are
        // on an arena, so we need to make a copy of this message to return.
        ret = extension->ptr.message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->ptr.message_value);
      }
    }
    Erase(number);
    return ret;
  }
}